

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalsAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EnvironmentalsAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EnvironmentalsAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EnvironmentalsAppearance *local_18;
  EnvironmentalsAppearance *this_local;
  
  local_18 = this;
  this_local = (EnvironmentalsAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Environmental Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tDensity:        ");
  ENUMS::GetEnumAsStringEntityDensity_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)(*(ushort *)&this->field_0x2 & 0xf),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tMasked/Cloaked: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1f);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EnvironmentalsAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Environmental Appearance:"
       << "\n\tDensity:        " << GetEnumAsStringEntityDensity( m_Density )
	   << "\n\tFrozen Status:  " << m_FrozenStatus
	   << "\n\tState:          " << m_State
	   << "\n\tMasked/Cloaked: " << m_MaskedCloaked
       << "\n";

    return ss.str();
}